

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O0

void __thiscall
AlphaVectorWeighted::AlphaVectorWeighted
          (AlphaVectorWeighted *this,PlanningUnitDecPOMDPDiscrete *pu,double weight)

{
  PlanningUnitDecPOMDPDiscrete *arg;
  size_t __n;
  undefined8 uVar1;
  PlanningUnitDecPOMDPDiscrete *in_RSI;
  E *in_RDI;
  double in_XMM0_Qa;
  AlphaVectorBG *unaff_retaddr;
  AlphaVectorWeighted *in_stack_00000020;
  PlanningUnitDecPOMDPDiscrete *in_stack_00000078;
  AlphaVectorPlanning *in_stack_00000080;
  AlphaVectorPlanning *in_stack_ffffffffffffff98;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffa8;
  value_type_conflict3 *__value;
  E *pEVar2;
  value_type_conflict3 local_25;
  double local_18;
  
  local_18 = in_XMM0_Qa;
  pEVar2 = in_RDI;
  AlphaVectorPlanning::AlphaVectorPlanning(in_stack_00000080,in_stack_00000078);
  AlphaVectorPOMDP::AlphaVectorPOMDP
            ((AlphaVectorPOMDP *)in_RDI,&PTR_construction_vtable_24__00d114a0,in_RSI);
  AlphaVectorBG::AlphaVectorBG(unaff_retaddr,&pEVar2->_vptr_E,in_RSI);
  in_RDI->_vptr_E = (_func_int **)&PTR__AlphaVectorWeighted_00d11438;
  *(undefined ***)&in_RDI[2]._m_error = &PTR__AlphaVectorWeighted_00d11488;
  *(undefined ***)&in_RDI->_m_error = &PTR__AlphaVectorWeighted_00d11460;
  pEVar2 = in_RDI + 1;
  arg = AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff98);
  __n = PlanningUnitMADPDiscrete::GetNrStates(in_stack_ffffffffffffffa0);
  __value = &local_25;
  std::allocator<double>::allocator((allocator<double> *)0x956bf3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)pEVar2,__n,__value,in_stack_ffffffffffffffa8
            );
  std::allocator<double>::~allocator((allocator<double> *)0x956c18);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x956c2b);
  if ((0.0 <= local_18) && (local_18 <= 1.0)) {
    BackProjectWeights(in_stack_00000020);
    return;
  }
  uVar1 = __cxa_allocate_exception(0x28);
  E::E(in_RDI,(char *)arg);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorWeighted::
AlphaVectorWeighted(const PlanningUnitDecPOMDPDiscrete* pu,
                    double weight) :
    AlphaVectorPlanning(pu),
    AlphaVectorPOMDP(pu),
    AlphaVectorBG(pu),
    _m_weights(GetPU()->GetNrStates(),weight)
{
    if(weight < 0 || weight > 1)
        throw(E("AlphaVectorWeighted ctor: weight should be >=0 and <=1"));
    BackProjectWeights();
}